

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O1

void Abc_FlowRetime_ConstrainExact(Abc_Obj_t *pObj)

{
  Flow_Data_t **ppFVar1;
  Flow_Data_t *pFVar2;
  uint uVar3;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  Vec_Ptr_t *pVVar6;
  bool bVar7;
  MinRegMan_t *pMVar8;
  void **ppvVar9;
  long lVar10;
  long *plVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  
  ppFVar1 = &pManMR->pDataArray;
  uVar3 = pObj->Id;
  if ((undefined1  [24])((undefined1  [24])(*ppFVar1)[uVar3] & (undefined1  [24])0x80) !=
      (undefined1  [24])0x0) {
    pManMR->nConservConstraints = pManMR->nConservConstraints + -1;
    pFVar2 = *ppFVar1 + uVar3;
    *(byte *)pFVar2 = *(byte *)pFVar2 & 0x7f;
  }
  vNodes = pManMR->vNodes;
  if (pManMR->fIsForward == 0) {
    if (vNodes->nSize != 0) {
      __assert_fail("!Vec_PtrSize( vNodes )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                    ,0x215,"void Abc_FlowRetime_ConstrainExact_back(Abc_Obj_t *)");
    }
    if ((*(uint *)&pObj->field_0x14 & 0xf) == 8) {
      __assert_fail("!Abc_ObjIsLatch(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                    ,0x216,"void Abc_FlowRetime_ConstrainExact_back(Abc_Obj_t *)");
    }
    if (pManMR->vTimeEdges[(uint)pObj->Id].nSize != 0) {
      __assert_fail("!Vec_PtrSize( FTIMEEDGES(pObj) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                    ,0x217,"void Abc_FlowRetime_ConstrainExact_back(Abc_Obj_t *)");
    }
    pVVar4 = pManMR->vExactNodes;
    uVar3 = pVVar4->nCap;
    if (pVVar4->nSize == uVar3) {
      if ((int)uVar3 < 0x10) {
        if (pVVar4->pArray == (void **)0x0) {
          ppvVar9 = (void **)malloc(0x80);
        }
        else {
          ppvVar9 = (void **)realloc(pVVar4->pArray,0x80);
        }
        pVVar4->pArray = ppvVar9;
        iVar15 = 0x10;
      }
      else {
        iVar15 = uVar3 * 2;
        if (iVar15 <= (int)uVar3) goto LAB_004d7a01;
        if (pVVar4->pArray == (void **)0x0) {
          ppvVar9 = (void **)malloc((ulong)uVar3 << 4);
        }
        else {
          ppvVar9 = (void **)realloc(pVVar4->pArray,(ulong)uVar3 << 4);
        }
        pVVar4->pArray = ppvVar9;
      }
      pVVar4->nCap = iVar15;
    }
LAB_004d7a01:
    iVar15 = pVVar4->nSize;
    pVVar4->nSize = iVar15 + 1;
    pVVar4->pArray[iVar15] = pObj;
    Abc_FlowRetime_ConstrainExact_back_rec(pObj,vNodes,0);
    pMVar8 = pManMR;
    lVar10 = (long)vNodes->nSize;
    if (0 < lVar10) {
      do {
        if (vNodes->nSize < lVar10) goto LAB_004d7c7e;
        plVar11 = (long *)((ulong)vNodes->pArray[lVar10 + -1] & 0xfffffffffffffffe);
        if ((long *)vNodes->pArray[lVar10 + -1] == plVar11) {
          if ((*(uint *)((long)plVar11 + 0x14) & 0xf) == 8) {
            __assert_fail("!Abc_ObjIsLatch(pReg)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                          ,0x221,"void Abc_FlowRetime_ConstrainExact_back(Abc_Obj_t *)");
          }
          if (0 < *(int *)((long)plVar11 + 0x2c)) {
            lVar12 = 0;
            do {
              lVar5 = *(long *)(*(long *)(*(long *)(*plVar11 + 0x20) + 8) +
                               (long)*(int *)(plVar11[6] + lVar12 * 4) * 8);
              uVar3 = *(uint *)(lVar5 + 0x14);
              uVar13 = uVar3 >> 0xc;
              uVar14 = (uint)((*(uint *)((long)plVar11 + 0x14) & 0xf) == 7) +
                       (*(uint *)((long)plVar11 + 0x14) >> 0xc);
              if (uVar13 <= uVar14) {
                uVar13 = uVar14;
              }
              *(uint *)(lVar5 + 0x14) = uVar3 & 0xfff | uVar13 << 0xc;
              lVar12 = lVar12 + 1;
            } while (lVar12 < *(int *)((long)plVar11 + 0x2c));
          }
          if (pMVar8->maxDelay < (int)(*(uint *)((long)plVar11 + 0x14) >> 0xc)) {
            __assert_fail("(int)pReg->Level <= pManMR->maxDelay",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                          ,0x224,"void Abc_FlowRetime_ConstrainExact_back(Abc_Obj_t *)");
          }
          *(uint *)((long)plVar11 + 0x14) = *(uint *)((long)plVar11 + 0x14) & 0xfcf;
        }
        bVar7 = 1 < lVar10;
        lVar10 = lVar10 + -1;
      } while (bVar7);
    }
    lVar10 = (long)vNodes->nSize;
    if (0 < (long)vNodes->nSize) {
      do {
        if (vNodes->nSize < lVar10) goto LAB_004d7c7e;
        plVar11 = (long *)((ulong)vNodes->pArray[lVar10 + -1] & 0xfffffffffffffffe);
        if ((long *)vNodes->pArray[lVar10 + -1] != plVar11) {
          if (0 < *(int *)((long)plVar11 + 0x2c)) {
            lVar12 = 0;
            do {
              lVar5 = *(long *)(*(long *)(*(long *)(*plVar11 + 0x20) + 8) +
                               (long)*(int *)(plVar11[6] + lVar12 * 4) * 8);
              uVar3 = *(uint *)(lVar5 + 0x14);
              if ((uVar3 & 0xf) != 8) {
                uVar14 = (uint)((*(uint *)((long)plVar11 + 0x14) & 0xf) == 7) +
                         (*(uint *)((long)plVar11 + 0x14) >> 0xc);
                uVar13 = uVar3 >> 0xc;
                if (uVar3 >> 0xc <= uVar14) {
                  uVar13 = uVar14;
                }
                *(uint *)(lVar5 + 0x14) = uVar3 & 0xfff | uVar13 << 0xc;
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 < *(int *)((long)plVar11 + 0x2c));
          }
          if (*(uint *)((long)plVar11 + 0x14) >> 0xc == pManMR->maxDelay) {
            pVVar6 = pManMR->vTimeEdges;
            uVar3 = pObj->Id;
            pVVar4 = pVVar6 + uVar3;
            uVar13 = pVVar6[uVar3].nCap;
            if (pVVar6[uVar3].nSize == uVar13) {
              if ((int)uVar13 < 0x10) {
                if (pVVar4->pArray == (void **)0x0) {
                  ppvVar9 = (void **)malloc(0x80);
                }
                else {
                  ppvVar9 = (void **)realloc(pVVar4->pArray,0x80);
                }
                pVVar4->pArray = ppvVar9;
                iVar15 = 0x10;
              }
              else {
                iVar15 = uVar13 * 2;
                if (iVar15 <= (int)uVar13) goto LAB_004d7c33;
                if (pVVar4->pArray == (void **)0x0) {
                  ppvVar9 = (void **)malloc((ulong)uVar13 << 4);
                }
                else {
                  ppvVar9 = (void **)realloc(pVVar4->pArray,(ulong)uVar13 << 4);
                }
                pVVar4->pArray = ppvVar9;
              }
              pVVar4->nCap = iVar15;
            }
LAB_004d7c33:
            iVar15 = pVVar4->nSize;
            pVVar4->nSize = iVar15 + 1;
            pVVar4->pArray[iVar15] = plVar11;
            pManMR->nExactConstraints = pManMR->nExactConstraints + 1;
          }
          *(uint *)((long)plVar11 + 0x14) = *(uint *)((long)plVar11 + 0x14) & 0xfcf;
        }
        bVar7 = 1 < lVar10;
        lVar10 = lVar10 + -1;
      } while (bVar7);
    }
    goto LAB_004d7c67;
  }
  if (vNodes->nSize != 0) {
    __assert_fail("!Vec_PtrSize(vNodes)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                  ,0x1ca,"void Abc_FlowRetime_ConstrainExact_forw(Abc_Obj_t *)");
  }
  if ((*(uint *)&pObj->field_0x14 & 0xf) == 8) {
    __assert_fail("!Abc_ObjIsLatch(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                  ,0x1cb,"void Abc_FlowRetime_ConstrainExact_forw(Abc_Obj_t *)");
  }
  if (pManMR->vTimeEdges[(uint)pObj->Id].nSize != 0) {
    __assert_fail("!Vec_PtrSize( FTIMEEDGES(pObj) )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                  ,0x1cc,"void Abc_FlowRetime_ConstrainExact_forw(Abc_Obj_t *)");
  }
  pVVar4 = pManMR->vExactNodes;
  uVar3 = pVVar4->nCap;
  if (pVVar4->nSize == uVar3) {
    if ((int)uVar3 < 0x10) {
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar9 = (void **)malloc(0x80);
      }
      else {
        ppvVar9 = (void **)realloc(pVVar4->pArray,0x80);
      }
      pVVar4->pArray = ppvVar9;
      iVar15 = 0x10;
    }
    else {
      iVar15 = uVar3 * 2;
      if (iVar15 <= (int)uVar3) goto LAB_004d7780;
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar9 = (void **)malloc((ulong)uVar3 << 4);
      }
      else {
        ppvVar9 = (void **)realloc(pVVar4->pArray,(ulong)uVar3 << 4);
      }
      pVVar4->pArray = ppvVar9;
    }
    pVVar4->nCap = iVar15;
  }
LAB_004d7780:
  iVar15 = pVVar4->nSize;
  pVVar4->nSize = iVar15 + 1;
  pVVar4->pArray[iVar15] = pObj;
  Abc_FlowRetime_ConstrainExact_forw_rec(pObj,vNodes,0);
  pMVar8 = pManMR;
  lVar10 = (long)vNodes->nSize;
  if (0 < lVar10) {
    do {
      if (vNodes->nSize < lVar10) goto LAB_004d7c7e;
      plVar11 = (long *)((ulong)vNodes->pArray[lVar10 + -1] & 0xfffffffffffffffe);
      if ((long *)vNodes->pArray[lVar10 + -1] == plVar11) {
        if ((*(uint *)((long)plVar11 + 0x14) & 0xf) == 8) {
          __assert_fail("!Abc_ObjIsLatch(pReg)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                        ,0x1d6,"void Abc_FlowRetime_ConstrainExact_forw(Abc_Obj_t *)");
        }
        if (0 < *(int *)((long)plVar11 + 0x1c)) {
          lVar12 = 0;
          do {
            lVar5 = *(long *)(*(long *)(*(long *)(*plVar11 + 0x20) + 8) +
                             (long)*(int *)(plVar11[4] + lVar12 * 4) * 8);
            uVar3 = *(uint *)(lVar5 + 0x14);
            uVar13 = uVar3 >> 0xc;
            uVar14 = (uint)((*(uint *)((long)plVar11 + 0x14) & 0xf) == 7) +
                     (*(uint *)((long)plVar11 + 0x14) >> 0xc);
            if (uVar13 <= uVar14) {
              uVar13 = uVar14;
            }
            *(uint *)(lVar5 + 0x14) = uVar3 & 0xfff | uVar13 << 0xc;
            lVar12 = lVar12 + 1;
          } while (lVar12 < *(int *)((long)plVar11 + 0x1c));
        }
        if (pMVar8->maxDelay < (int)(*(uint *)((long)plVar11 + 0x14) >> 0xc)) {
          __assert_fail("(int)pReg->Level <= pManMR->maxDelay",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                        ,0x1d9,"void Abc_FlowRetime_ConstrainExact_forw(Abc_Obj_t *)");
        }
        *(uint *)((long)plVar11 + 0x14) = *(uint *)((long)plVar11 + 0x14) & 0xfcf;
      }
      bVar7 = 1 < lVar10;
      lVar10 = lVar10 + -1;
    } while (bVar7);
  }
  lVar10 = (long)vNodes->nSize;
  if (0 < (long)vNodes->nSize) {
    do {
      if (vNodes->nSize < lVar10) {
LAB_004d7c7e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      plVar11 = (long *)((ulong)vNodes->pArray[lVar10 + -1] & 0xfffffffffffffffe);
      if ((long *)vNodes->pArray[lVar10 + -1] != plVar11) {
        if (0 < *(int *)((long)plVar11 + 0x1c)) {
          lVar12 = 0;
          do {
            lVar5 = *(long *)(*(long *)(*(long *)(*plVar11 + 0x20) + 8) +
                             (long)*(int *)(plVar11[4] + lVar12 * 4) * 8);
            uVar3 = *(uint *)(lVar5 + 0x14);
            if ((uVar3 & 0xf) != 8) {
              uVar14 = (uint)((*(uint *)((long)plVar11 + 0x14) & 0xf) == 7) +
                       (*(uint *)((long)plVar11 + 0x14) >> 0xc);
              uVar13 = uVar3 >> 0xc;
              if (uVar3 >> 0xc <= uVar14) {
                uVar13 = uVar14;
              }
              *(uint *)(lVar5 + 0x14) = uVar3 & 0xfff | uVar13 << 0xc;
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < *(int *)((long)plVar11 + 0x1c));
        }
        if (*(uint *)((long)plVar11 + 0x14) >> 0xc == pManMR->maxDelay) {
          pVVar6 = pManMR->vTimeEdges;
          uVar3 = pObj->Id;
          pVVar4 = pVVar6 + uVar3;
          uVar13 = pVVar6[uVar3].nCap;
          if (pVVar6[uVar3].nSize == uVar13) {
            if ((int)uVar13 < 0x10) {
              if (pVVar4->pArray == (void **)0x0) {
                ppvVar9 = (void **)malloc(0x80);
              }
              else {
                ppvVar9 = (void **)realloc(pVVar4->pArray,0x80);
              }
              pVVar4->pArray = ppvVar9;
              iVar15 = 0x10;
            }
            else {
              iVar15 = uVar13 * 2;
              if (iVar15 <= (int)uVar13) goto LAB_004d79b5;
              if (pVVar4->pArray == (void **)0x0) {
                ppvVar9 = (void **)malloc((ulong)uVar13 << 4);
              }
              else {
                ppvVar9 = (void **)realloc(pVVar4->pArray,(ulong)uVar13 << 4);
              }
              pVVar4->pArray = ppvVar9;
            }
            pVVar4->nCap = iVar15;
          }
LAB_004d79b5:
          iVar15 = pVVar4->nSize;
          pVVar4->nSize = iVar15 + 1;
          pVVar4->pArray[iVar15] = plVar11;
          pManMR->nExactConstraints = pManMR->nExactConstraints + 1;
        }
        *(uint *)((long)plVar11 + 0x14) = *(uint *)((long)plVar11 + 0x14) & 0xfcf;
      }
      bVar7 = 1 < lVar10;
      lVar10 = lVar10 + -1;
    } while (bVar7);
  }
LAB_004d7c67:
  vNodes->nSize = 0;
  return;
}

Assistant:

void Abc_FlowRetime_ConstrainExact( Abc_Obj_t * pObj ) {

  if (FTEST( pObj, CONSERVATIVE )) {
    pManMR->nConservConstraints--;
    FUNSET( pObj, CONSERVATIVE );
  }

#if !defined(IGNORE_TIMING)
  if (pManMR->fIsForward) {
    Abc_FlowRetime_ConstrainExact_forw(pObj);
  } else {
    Abc_FlowRetime_ConstrainExact_back(pObj);
  }
#endif
}